

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O1

void __thiscall
Validator_resetEmptyMathML_Test::~Validator_resetEmptyMathML_Test
          (Validator_resetEmptyMathML_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Validator, resetEmptyMathML)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c = libcellml::Component::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::ResetPtr r = libcellml::Reset::create();

    // Empty test_value and reset_value math block
    // TODO: For now, empty maths blocks are valid. Issue #365.
    r->setVariable(v1);
    r->setTestVariable(v2);
    r->setOrder(9);
    r->setResetValue(EMPTY_MATH);
    r->setTestValue(EMPTY_MATH);

    c->setName("comp");
    v1->setName("var");
    v1->setUnits("second");
    v2->setName("var2");
    v2->setUnits("second");

    c->addVariable(v1);
    c->addVariable(v2);

    c->addReset(r);

    m->setName("main");
    m->addComponent(c);

    libcellml::ValidatorPtr validator = libcellml::Validator::create();
    validator->validateModel(m);

    EXPECT_EQ(size_t(0), validator->issueCount());
}